

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_invokespecial(ExecutionEngine *this)

{
  cp_info *constantPool_00;
  CONSTANT_Long_info CVar1;
  MethodArea *object_00;
  _Map_pointer this_00;
  bool bVar2;
  int iVar3;
  VMStack *this_01;
  cp_info **ppcVar4;
  u1 *puVar5;
  char *pcVar6;
  cp_info *pcVar7;
  long lVar8;
  ostream *poVar9;
  Frame *this_02;
  Frame *pFVar10;
  Value VVar11;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> local_2d8;
  undefined1 local_281;
  vector<Value,_std::allocator<Value>_> local_280;
  string local_268 [32];
  string local_248 [32];
  Frame *local_228;
  Frame *newFrame;
  ClassRuntime *classRuntime;
  MethodArea *methodArea;
  ClassInstance *instance;
  Object *object;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1f8;
  const_iterator local_1f0;
  undefined1 local_1e8 [8];
  Value objectValue;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1d0;
  const_iterator local_1c8;
  Value *local_1c0;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1b8;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1b0;
  const_iterator local_1a8;
  undefined1 local_1a0 [8];
  Value value;
  undefined1 local_188 [4];
  int i_1;
  vector<Value,_std::allocator<Value>_> args;
  ushort local_166;
  char baseType;
  uint16_t i;
  uint16_t nargs;
  allocator local_149;
  string local_148 [8];
  string methodDescriptor;
  allocator local_121;
  string local_120 [8];
  string methodName;
  u2 local_fc;
  u2 uStack_fa;
  char cStack_f8;
  CONSTANT_NameAndType_info methodNameAndType;
  cp_info nameAndTypeCP;
  string local_d8 [8];
  string className;
  u2 local_b4;
  ushort uStack_b2;
  char cStack_b0;
  CONSTANT_Methodref_info methodInfo;
  cp_info methodCP;
  uint16_t methodIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_01 = VMStack::getInstance();
  operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)VMStack::getTopFrame(this_01);
  Frame::backupOperandStack
            ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool,
             (Frame *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node);
  ppcVar4 = Frame::getConstantPool
                      ((Frame *)operandStackBackup.c.
                                super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node);
  constantPool_00 = *ppcVar4;
  puVar5 = Frame::getCode((Frame *)operandStackBackup.c.
                                   super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_node,
                          *(uint32_t *)
                           operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node);
  methodCP.info._14_2_ = CONCAT11(puVar5[1],puVar5[2]);
  CVar1 = constantPool_00[(int)(CONCAT22(0,methodCP.info._14_2_) - 1)].info.long_info;
  cStack_b0 = (char)*(undefined8 *)(constantPool_00 + (int)(CONCAT22(0,methodCP.info._14_2_) - 1));
  if (cStack_b0 != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfad,"void ExecutionEngine::i_invokespecial()");
  }
  local_b4 = (u2)CVar1.high_bytes;
  pcVar6 = getFormattedConstant(constantPool_00,local_b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar6,(allocator *)((long)&nameAndTypeCP.info + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)((long)&nameAndTypeCP.info + 0xf));
  uStack_b2 = CVar1.high_bytes._2_2_;
  pcVar7 = constantPool_00 + (int)(uStack_b2 - 1);
  CVar1 = (pcVar7->info).long_info;
  nameAndTypeCP.info.long_info = *(CONSTANT_Long_info *)((long)&pcVar7->info + 8);
  cStack_f8 = (char)*(undefined8 *)pcVar7;
  nameAndTypeCP._0_8_ = CVar1;
  if (cStack_f8 != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfb4,"void ExecutionEngine::i_invokespecial()");
  }
  local_fc = (u2)CVar1.high_bytes;
  pcVar6 = getFormattedConstant(constantPool_00,local_fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,pcVar6,&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  uStack_fa = CVar1.high_bytes._2_2_;
  pcVar6 = getFormattedConstant(constantPool_00,uStack_fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,pcVar6,&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"java/lang/Object");
  if (((bVar2) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d8,"java/lang/String"), bVar2)) &&
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"<init>"), bVar2)) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"java/lang/String");
    if (bVar2) {
      Frame::popTopOfOperandStack
                ((Frame *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node);
    }
    *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node =
         *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node + 3;
  }
  else {
    lVar8 = std::__cxx11::string::find((char *)local_d8,0x15050d);
    if (lVar8 != -1) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Tentando invocar metodo especial invalido: ");
      poVar9 = std::operator<<(poVar9,local_120);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    local_166 = 0;
    while (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148), *pcVar6 != ')') {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
      args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = *pcVar6;
      if ((args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ == 'D') ||
         (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._7_1_ == 'J')) {
        local_166 = local_166 + 2;
      }
      else {
        if (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._7_1_ == 'L') {
          do {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          } while (*pcVar6 != ';');
        }
        else if (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._7_1_ == '[') {
          do {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          } while (*pcVar6 == '[');
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          if (*pcVar6 == 'L') {
            do {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
            } while (*pcVar6 != ';');
          }
        }
        local_166 = local_166 + 1;
      }
    }
    std::vector<Value,_std::allocator<Value>_>::vector
              ((vector<Value,_std::allocator<Value>_> *)local_188);
    for (value.data.longValue._4_4_ = 0; value.data._4_4_ < (int)(uint)local_166;
        value.data.longValue._4_4_ = value.data.longValue._4_4_ + 1) {
      VVar11 = Frame::popTopOfOperandStack
                         ((Frame *)operandStackBackup.c.
                                   super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_node);
      value._0_8_ = VVar11.data;
      local_1a0._4_4_ = VVar11.type;
      local_1a0 = (undefined1  [8])VVar11._0_8_;
      if (local_1a0._4_4_ == PADDING) {
        local_1b8._M_current =
             (Value *)std::vector<Value,_std::allocator<Value>_>::begin
                                ((vector<Value,_std::allocator<Value>_> *)local_188);
        local_1b0 = __gnu_cxx::
                    __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_>::
                    operator+(&local_1b8,1);
        __gnu_cxx::__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>>::
        __normal_iterator<Value*>
                  ((__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>> *)
                   &local_1a8,&local_1b0);
        local_1c0 = (Value *)std::vector<Value,_std::allocator<Value>_>::insert
                                       ((vector<Value,_std::allocator<Value>_> *)local_188,local_1a8
                                        ,(value_type *)local_1a0);
      }
      else {
        local_1d0._M_current =
             (Value *)std::vector<Value,_std::allocator<Value>_>::begin
                                ((vector<Value,_std::allocator<Value>_> *)local_188);
        __gnu_cxx::__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>>::
        __normal_iterator<Value*>
                  ((__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>> *)
                   &local_1c8,&local_1d0);
        objectValue.data =
             (anon_union_8_10_52016fac_for_data)
             std::vector<Value,_std::allocator<Value>_>::insert
                       ((vector<Value,_std::allocator<Value>_> *)local_188,local_1c8,
                        (value_type *)local_1a0);
      }
    }
    VVar11 = Frame::popTopOfOperandStack
                       ((Frame *)operandStackBackup.c.
                                 super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node);
    objectValue._0_8_ = VVar11.data;
    local_1e8._4_4_ = VVar11.type;
    local_1e8 = (undefined1  [8])VVar11._0_8_;
    if (local_1e8._4_4_ != REFERENCE) {
      __assert_fail("objectValue.type == ValueType::REFERENCE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0xfe8,"void ExecutionEngine::i_invokespecial()");
    }
    local_1f8._M_current =
         (Value *)std::vector<Value,_std::allocator<Value>_>::begin
                            ((vector<Value,_std::allocator<Value>_> *)local_188);
    __gnu_cxx::__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>>::
    __normal_iterator<Value*>
              ((__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>> *)
               &local_1f0,&local_1f8);
    object = (Object *)
             std::vector<Value,_std::allocator<Value>_>::insert
                       ((vector<Value,_std::allocator<Value>_> *)local_188,local_1f0,
                        (value_type *)local_1e8);
    instance = (ClassInstance *)objectValue._0_8_;
    iVar3 = (*(code *)**(undefined8 **)objectValue._0_8_)();
    if (iVar3 != 0) {
      __assert_fail("object->objectType() == ObjectType::CLASS_INSTANCE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0xfec,"void ExecutionEngine::i_invokespecial()");
    }
    methodArea = (MethodArea *)instance;
    classRuntime = (ClassRuntime *)MethodArea::getInstance();
    newFrame = (Frame *)MethodArea::loadClassNamed((MethodArea *)classRuntime,(string *)local_d8);
    this_02 = (Frame *)operator_new(0xb8);
    object_00 = methodArea;
    pFVar10 = newFrame;
    local_281 = 1;
    std::__cxx11::string::string(local_248,local_120);
    std::__cxx11::string::string(local_268,local_148);
    std::vector<Value,_std::allocator<Value>_>::vector
              (&local_280,(vector<Value,_std::allocator<Value>_> *)local_188);
    Frame::Frame(this_02,(ClassInstance *)object_00,(ClassRuntime *)pFVar10,(string *)local_248,
                 (string *)local_268,&local_280);
    local_281 = 0;
    std::vector<Value,_std::allocator<Value>_>::~vector(&local_280);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_248);
    local_228 = this_02;
    pFVar10 = VMStack::getTopFrame(this_01);
    this_00 = operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (pFVar10 ==
        (Frame *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node) {
      VMStack::addFrame(this_01,local_228);
      bVar2 = false;
    }
    else {
      std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::stack
                (&local_2d8,
                 (stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool);
      Frame::setOperandStackFromBackup((Frame *)this_00,&local_2d8);
      std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::~stack(&local_2d8);
      pFVar10 = local_228;
      if (local_228 != (Frame *)0x0) {
        Frame::~Frame(local_228);
        operator_delete(pFVar10);
      }
      bVar2 = true;
    }
    std::vector<Value,_std::allocator<Value>_>::~vector
              ((vector<Value,_std::allocator<Value>_> *)local_188);
    if (!bVar2) {
      *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node =
           *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 3;
    }
  }
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_d8);
  std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::~stack
            ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool);
  return;
}

Assistant:

void ExecutionEngine::i_invokespecial() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);
    
    // casos especiais
    if ((className == "java/lang/Object" || className == "java/lang/String") && methodName == "<init>") {
        if (className == "java/lang/String") {
            topFrame->popTopOfOperandStack();
        }
        
        topFrame->pc += 3;
        return;
    }
    // fim dos casos especiais
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo especial invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        Value objectValue = topFrame->popTopOfOperandStack();
        assert(objectValue.type == ValueType::REFERENCE); // necessita ser uma referência para objeto
        args.insert(args.begin(), objectValue);

        Object *object = objectValue.data.object;
        assert(object->objectType() == ObjectType::CLASS_INSTANCE); // objeto precisa ser uma instância
        ClassInstance *instance = (ClassInstance *) object;

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        
        Frame *newFrame = new Frame(instance, classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}